

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comment_on_column_info.cpp
# Opt level: O2

void __thiscall
duckdb::SetColumnCommentInfo::SetColumnCommentInfo
          (SetColumnCommentInfo *this,string *catalog,string *schema,string *name,
          string *column_name,Value *comment_value,OnEntryNotFound if_not_found)

{
  string local_90;
  string local_70;
  string local_50;
  
  ::std::__cxx11::string::string((string *)&local_50,(string *)catalog);
  ::std::__cxx11::string::string((string *)&local_70,(string *)schema);
  ::std::__cxx11::string::string((string *)&local_90,(string *)name);
  AlterInfo::AlterInfo
            (&this->super_AlterInfo,SET_COLUMN_COMMENT,&local_50,&local_70,&local_90,if_not_found);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__SetColumnCommentInfo_027a7fd8;
  (this->super_AlterInfo).field_0x71 = 0;
  ::std::__cxx11::string::string((string *)&this->column_name,(string *)column_name);
  Value::Value(&this->comment_value,comment_value);
  return;
}

Assistant:

SetColumnCommentInfo::SetColumnCommentInfo(string catalog, string schema, string name, string column_name,
                                           Value comment_value, OnEntryNotFound if_not_found)
    : AlterInfo(AlterType::SET_COLUMN_COMMENT, std::move(catalog), std::move(schema), std::move(name), if_not_found),
      catalog_entry_type(CatalogType::INVALID), column_name(std::move(column_name)),
      comment_value(std::move(comment_value)) {
}